

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx *dctx,int *nbSeqPtr,void *src,size_t srcSize)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  BYTE *istart;
  byte *pbVar7;
  size_t sVar8;
  byte *pbVar9;
  
  if (srcSize == 0) {
    return 0xffffffffffffffb8;
  }
  pbVar7 = (byte *)((long)src + 1);
  bVar1 = *src;
  uVar6 = (uint)bVar1;
  bVar2 = bVar1 != 0;
  if (bVar1 == 0) {
    uVar6 = 0;
  }
  else if ((char)bVar1 < '\0') {
    if (uVar6 == 0xff) {
      if (2 < (long)srcSize) {
        pbVar7 = (byte *)((long)src + 3);
        uVar6 = *(ushort *)((long)src + 1) + 0x7f00;
        goto LAB_0015bd91;
      }
    }
    else if (1 < (long)srcSize) {
      pbVar7 = (byte *)((long)src + 2);
      uVar6 = (uVar6 * 0x100 + (uint)*(byte *)((long)src + 1)) - 0x8000;
      goto LAB_0015bd91;
    }
    sVar8 = 0xffffffffffffffb8;
    bVar2 = false;
    goto LAB_0015bd99;
  }
LAB_0015bd91:
  *nbSeqPtr = uVar6;
  sVar8 = 1;
LAB_0015bd99:
  sVar4 = sVar8;
  if ((bVar2) &&
     (pbVar9 = (byte *)(srcSize + (long)src), sVar4 = 0xffffffffffffffb8, pbVar7 + 4 <= pbVar9)) {
    bVar1 = *pbVar7;
    sVar3 = ZSTD_buildSeqTable((dctx->entropy).LLTable,&dctx->LLTptr,(uint)(bVar1 >> 6),0x23,9,
                               pbVar7 + 1,(long)pbVar9 - (long)(pbVar7 + 1),LL_base,LL_bits,
                               LL_defaultDTable,dctx->fseEntropy);
    sVar5 = 0;
    sVar4 = sVar3;
    if (0xffffffffffffff88 < sVar3) {
      sVar8 = 0xffffffffffffffec;
      sVar4 = sVar5;
    }
    pbVar7 = pbVar7 + sVar4 + 1;
    if (0xffffffffffffff88 >= sVar3) {
      sVar3 = ZSTD_buildSeqTable((dctx->entropy).OFTable,&dctx->OFTptr,bVar1 >> 4 & set_repeat,0x1f,
                                 8,pbVar7,(long)pbVar9 - (long)pbVar7,OF_base,OF_bits,
                                 OF_defaultDTable,dctx->fseEntropy);
      sVar5 = 0;
      sVar4 = sVar3;
      if (0xffffffffffffff88 < sVar3) {
        sVar8 = 0xffffffffffffffec;
        sVar4 = 0;
      }
      pbVar7 = pbVar7 + sVar4;
      if (sVar3 < 0xffffffffffffff89) {
        sVar4 = ZSTD_buildSeqTable((dctx->entropy).MLTable,&dctx->MLTptr,bVar1 >> 2 & set_repeat,
                                   0x34,9,pbVar7,(long)pbVar9 - (long)pbVar7,ML_base,ML_bits,
                                   ML_defaultDTable,dctx->fseEntropy);
        sVar5 = (size_t)(sVar4 < 0xffffffffffffff89);
        if (sVar4 >= 0xffffffffffffff89) {
          sVar8 = 0xffffffffffffffec;
          sVar4 = 0;
        }
        pbVar7 = pbVar7 + sVar4;
      }
    }
    sVar4 = sVar8;
    if ((char)sVar5 != '\0') {
      sVar4 = (long)pbVar7 - (long)src;
    }
  }
  return sVar4;
}

Assistant:

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx* dctx, int* nbSeqPtr,
                             const void* src, size_t srcSize)
{
    const BYTE* const istart = (const BYTE* const)src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip = istart;
    DEBUGLOG(5, "ZSTD_decodeSeqHeaders");

    /* check */
    if (srcSize < MIN_SEQUENCES_SIZE) return ERROR(srcSize_wrong);

    /* SeqHead */
    {   int nbSeq = *ip++;
        if (!nbSeq) { *nbSeqPtr=0; return 1; }
        if (nbSeq > 0x7F) {
            if (nbSeq == 0xFF) {
                if (ip+2 > iend) return ERROR(srcSize_wrong);
                nbSeq = MEM_readLE16(ip) + LONGNBSEQ, ip+=2;
            } else {
                if (ip >= iend) return ERROR(srcSize_wrong);
                nbSeq = ((nbSeq-0x80)<<8) + *ip++;
            }
        }
        *nbSeqPtr = nbSeq;
    }

    /* FSE table descriptors */
    if (ip+4 > iend) return ERROR(srcSize_wrong); /* minimum possible size */
    {   symbolEncodingType_e const LLtype = (symbolEncodingType_e)(*ip >> 6);
        symbolEncodingType_e const OFtype = (symbolEncodingType_e)((*ip >> 4) & 3);
        symbolEncodingType_e const MLtype = (symbolEncodingType_e)((*ip >> 2) & 3);
        ip++;

        /* Build DTables */
        {   size_t const llhSize = ZSTD_buildSeqTable(dctx->entropy.LLTable, &dctx->LLTptr,
                                                      LLtype, MaxLL, LLFSELog,
                                                      ip, iend-ip,
                                                      LL_base, LL_bits,
                                                      LL_defaultDTable, dctx->fseEntropy);
            if (ZSTD_isError(llhSize)) return ERROR(corruption_detected);
            ip += llhSize;
        }

        {   size_t const ofhSize = ZSTD_buildSeqTable(dctx->entropy.OFTable, &dctx->OFTptr,
                                                      OFtype, MaxOff, OffFSELog,
                                                      ip, iend-ip,
                                                      OF_base, OF_bits,
                                                      OF_defaultDTable, dctx->fseEntropy);
            if (ZSTD_isError(ofhSize)) return ERROR(corruption_detected);
            ip += ofhSize;
        }

        {   size_t const mlhSize = ZSTD_buildSeqTable(dctx->entropy.MLTable, &dctx->MLTptr,
                                                      MLtype, MaxML, MLFSELog,
                                                      ip, iend-ip,
                                                      ML_base, ML_bits,
                                                      ML_defaultDTable, dctx->fseEntropy);
            if (ZSTD_isError(mlhSize)) return ERROR(corruption_detected);
            ip += mlhSize;
        }
    }

    return ip-istart;
}